

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int parse_int(int *out,char **str)

{
  char *pcVar1;
  uint uVar2;
  
  *out = 0;
  pcVar1 = *str;
  if ((byte)(*pcVar1 - 0x3aU) < 0xf6) {
    return -1;
  }
  uVar2 = (uint)(byte)(*pcVar1 - 0x30);
  while( true ) {
    pcVar1 = pcVar1 + 1;
    *str = pcVar1;
    if ((byte)(*pcVar1 - 0x3aU) < 0xf6) break;
    uVar2 = (uint)(byte)(*pcVar1 - 0x30) + uVar2 * 10;
  }
  *out = uVar2;
  return 0;
}

Assistant:

static int parse_int(int *out, const char **str)
{
	int i = 0;
	*out = 0;
	if(**str < '0' || **str > '9')
		return -1;

	i = **str - '0';
	(*str)++;

	while(1)
	{
		if(**str < '0' || **str > '9')
		{
			*out = i;
			return 0;
		}

		i = (i*10) + (**str - '0');
		(*str)++;
	}

	return 0;
}